

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void MapOptHandler_PrecacheTextures(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  TArray<FString,_FString> *this;
  FString local_20;
  level_info_t *local_18;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  local_18 = info;
  info_local = (level_info_t *)parse;
  FMapInfoParser::ParseAssign(parse);
  do {
    FScanner::MustGetString((FScanner *)info_local);
    this = &local_18->PrecacheTextures;
    FString::FString(&local_20,*(char **)info_local);
    TArray<FString,_FString>::Push(this,&local_20);
    FString::~FString(&local_20);
    bVar1 = FScanner::CheckString((FScanner *)info_local,",");
  } while (bVar1);
  return;
}

Assistant:

DEFINE_MAP_OPTION(PrecacheTextures, true)
{
	parse.ParseAssign();

	do
	{
		parse.sc.MustGetString();
		//the texture manager is not initialized here so all we can do is store the texture's name.
		info->PrecacheTextures.Push(parse.sc.String);
	} while (parse.sc.CheckString(","));
}